

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

size_t get_ngram_size_for(IndexType type)

{
  runtime_error *this;
  undefined4 in_EDI;
  size_t local_8;
  
  switch(in_EDI) {
  case 1:
    local_8 = 3;
    break;
  case 2:
    local_8 = 4;
    break;
  case 3:
    local_8 = 4;
    break;
  case 4:
    local_8 = 8;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unhandled index type (ngram)");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_8;
}

Assistant:

size_t get_ngram_size_for(IndexType type) {
    switch (type) {
        case IndexType::GRAM3:
            return 3;
        case IndexType::HASH4:
            return 4;
        case IndexType::TEXT4:
            return 4;
        case IndexType::WIDE8:
            return 8;
    }
    throw std::runtime_error("unhandled index type (ngram)");
}